

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_stringsegment.cpp
# Opt level: O1

bool __thiscall
icu_63::numparse::impl::StringSegment::startsWith(StringSegment *this,UnicodeSet *uniset)

{
  UBool UVar1;
  UChar32 c;
  bool bVar2;
  
  c = getCodePoint(this);
  if (c == -1) {
    bVar2 = false;
  }
  else {
    UVar1 = UnicodeSet::contains(uniset,c);
    bVar2 = UVar1 != '\0';
  }
  return bVar2;
}

Assistant:

bool StringSegment::startsWith(const UnicodeSet& uniset) const {
    // TODO: Move UnicodeSet case-folding logic here.
    // TODO: Handle string matches here instead of separately.
    UChar32 cp = getCodePoint();
    if (cp == -1) {
        return false;
    }
    return uniset.contains(cp);
}